

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planner.cpp
# Opt level: O1

int __thiscall despot::Planner::RunPlanning(Planner *this,int argc,char **argv)

{
  string world_type_00;
  string solver_type_00;
  Logger *pLVar1;
  World *pWVar2;
  int iVar3;
  Option *pOVar4;
  clock_t main_clock_start;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Belief *belief;
  Solver *solver_00;
  undefined4 extraout_var_03;
  undefined8 in_stack_fffffffffffffea8;
  int in_stack_fffffffffffffeb0;
  bool search_solver;
  Logger *logger;
  int num_runs;
  int time_limit;
  Option *local_138;
  string world_type;
  string belief_type;
  string solver_type;
  long *local_d0 [2];
  long local_c0 [2];
  ulong local_b0;
  Belief *local_a8;
  World *local_a0;
  long *local_98 [2];
  long local_88 [2];
  Solver *solver;
  string local_70;
  long *local_50 [2];
  long local_40 [2];
  DSPOMDP *model;
  undefined4 extraout_var_02;
  
  (*(this->super_PlannerBase)._vptr_PlannerBase[5])(&solver_type,this);
  num_runs = 1;
  world_type._M_dataplus._M_p = (pointer)&world_type.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&world_type,"pomdp","");
  belief_type._M_dataplus._M_p = (pointer)&belief_type.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&belief_type,"DEFAULT","");
  time_limit = -1;
  pOVar4 = PlannerBase::InitializeParamers
                     (&this->super_PlannerBase,argc,argv,&solver_type,&search_solver,&num_runs,
                      &world_type,&belief_type,&time_limit);
  if (pOVar4 != (Option *)0x0) {
    main_clock_start = clock();
    iVar3 = (*(this->super_PlannerBase)._vptr_PlannerBase[2])(this,pOVar4);
    model = (DSPOMDP *)CONCAT44(extraout_var,iVar3);
    if (model == (DSPOMDP *)0x0) {
      __assert_fail("model != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/planner.cpp"
                    ,0x57,"virtual int despot::Planner::RunPlanning(int, char **)");
    }
    iVar3 = (*(this->super_PlannerBase)._vptr_PlannerBase[3])(this,&world_type,model,pOVar4);
    local_a0 = (World *)CONCAT44(extraout_var_00,iVar3);
    if (local_a0 == (World *)0x0) {
      __assert_fail("world != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/planner.cpp"
                    ,0x5d,"virtual int despot::Planner::RunPlanning(int, char **)");
    }
    iVar3 = (*local_a0->_vptr_World[4])();
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_50,belief_type._M_dataplus._M_p,
               belief_type._M_dataplus._M_p + belief_type._M_string_length);
    iVar3 = (*model->_vptr_DSPOMDP[9])(model,CONCAT44(extraout_var_01,iVar3),local_50);
    belief = (Belief *)CONCAT44(extraout_var_02,iVar3);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    if (belief == (Belief *)0x0) {
      __assert_fail("belief != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/planner.cpp"
                    ,99,"virtual int despot::Planner::RunPlanning(int, char **)");
    }
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,solver_type._M_dataplus._M_p,
               solver_type._M_dataplus._M_p + solver_type._M_string_length);
    local_a8 = belief;
    solver_00 = PlannerBase::InitializeSolver
                          (&this->super_PlannerBase,model,belief,&local_70,pOVar4);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    logger = (Logger *)0x0;
    local_b0 = (ulong)(uint)num_runs;
    local_d0[0] = local_c0;
    local_138 = pOVar4;
    solver = solver_00;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_d0,world_type._M_dataplus._M_p,
               world_type._M_dataplus._M_p + world_type._M_string_length);
    iVar3 = time_limit;
    local_98[0] = local_88;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_98,solver_type._M_dataplus._M_p,
               solver_type._M_dataplus._M_p + solver_type._M_string_length);
    pWVar2 = local_a0;
    world_type_00._M_string_length._0_4_ = iVar3;
    world_type_00._M_dataplus._M_p = (pointer)local_d0;
    world_type_00._M_string_length._4_4_ = 0;
    world_type_00.field_2._M_allocated_capacity = (size_type)local_98;
    world_type_00.field_2._8_8_ = in_stack_fffffffffffffea8;
    solver_type_00._M_string_length._0_4_ = num_runs;
    solver_type_00._M_dataplus._M_p = (pointer)logger;
    solver_type_00._M_string_length._4_4_ = time_limit;
    solver_type_00.field_2._M_allocated_capacity = (size_type)local_138;
    solver_type_00.field_2._8_8_ = world_type._M_dataplus._M_p;
    PlannerBase::InitializeLogger
              (&this->super_PlannerBase,&logger,local_138,model,local_a8,solver_00,(int)local_b0,
               main_clock_start,local_a0,world_type_00,in_stack_fffffffffffffeb0,solver_type_00);
    if (local_98[0] != local_88) {
      operator_delete(local_98[0],local_88[0] + 1);
    }
    pOVar4 = local_138;
    if (local_d0[0] != local_c0) {
      operator_delete(local_d0[0],local_c0[0] + 1);
    }
    PlannerBase::DisplayParameters(&this->super_PlannerBase,pOVar4,model);
    pLVar1 = logger;
    iVar3 = (*pWVar2->_vptr_World[4])(pWVar2);
    (*pLVar1->_vptr_Logger[2])(pLVar1,CONCAT44(extraout_var_03,iVar3));
    this->step_ = 0;
    this->round_ = 0;
    (*(this->super_PlannerBase)._vptr_PlannerBase[8])(this,&solver,pWVar2,logger);
    (*logger->_vptr_Logger[3])();
    PlannerBase::PrintResult(&this->super_PlannerBase,1,logger,main_clock_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)belief_type._M_dataplus._M_p != &belief_type.field_2) {
    operator_delete(belief_type._M_dataplus._M_p,belief_type.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)world_type._M_dataplus._M_p != &world_type.field_2) {
    operator_delete(world_type._M_dataplus._M_p,world_type.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)solver_type._M_dataplus._M_p != &solver_type.field_2) {
    operator_delete(solver_type._M_dataplus._M_p,solver_type.field_2._M_allocated_capacity + 1);
  }
  return 0;
}

Assistant:

int Planner::RunPlanning(int argc, char *argv[]) {

	/* =========================
	 * initialize parameters
	 * =========================*/
	string solver_type = ChooseSolver(); //"DESPOT";
	bool search_solver;
	int num_runs = 1;
	string world_type = "pomdp";
	string belief_type = "DEFAULT";
	int time_limit = -1;

	option::Option *options = InitializeParamers(argc, argv, solver_type,
			search_solver, num_runs, world_type, belief_type, time_limit);
	if(options==NULL)
		return 0;
	clock_t main_clock_start = clock();

	/* =========================
	 * initialize model
	 * =========================*/
	DSPOMDP *model = InitializeModel(options);
	assert(model != NULL);

	/* =========================
	 * initialize world
	 * =========================*/
	World *world = InitializeWorld(world_type, model, options);
	assert(world != NULL);

	/* =========================
	 * initialize belief
	 * =========================*/
	Belief* belief = model->InitialBelief(world->GetCurrentState(), belief_type);
	assert(belief != NULL);

	/* =========================
	 * initialize solver
	 * =========================*/
	Solver *solver = InitializeSolver(model, belief, solver_type, options);

	/* =========================
	 * initialize logger
	 * =========================*/
	Logger *logger = NULL;
	InitializeLogger(logger, options, model, belief, solver, num_runs,
			main_clock_start, world, world_type, time_limit, solver_type);
	//world->world_seed(world_seed);

	/* =========================
	 * Display parameters
	 * =========================*/
	DisplayParameters(options, model);

	/* =========================
	 * run planning
	 * =========================*/
	logger->InitRound(world->GetCurrentState());
	round_=0; step_=0;
	PlanningLoop(solver, world, logger);
	logger->EndRound();

	PrintResult(1, logger, main_clock_start);

	return 0;
}